

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode doh2ai(dohentry *de,char *hostname,int port,Curl_addrinfo **aip)

{
  in_addr_t iVar1;
  sockaddr *psVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  size_t sVar5;
  Curl_addrinfo *pCVar6;
  ushort local_72;
  curl_socklen_t cStack_70;
  sa_family_t addrtype;
  size_t ss_size;
  size_t hostlen;
  int i;
  CURLcode result;
  sockaddr_in6 *addr6;
  sockaddr_in *addr;
  Curl_addrinfo *firstai;
  Curl_addrinfo *prevai;
  Curl_addrinfo *ai;
  Curl_addrinfo **aip_local;
  int port_local;
  char *hostname_local;
  dohentry *de_local;
  
  firstai = (Curl_addrinfo *)0x0;
  addr = (sockaddr_in *)0x0;
  hostlen._4_4_ = CURLE_OK;
  sVar5 = strlen(hostname);
  if (de->numaddr == 0) {
    de_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    for (hostlen._0_4_ = 0; (int)hostlen < de->numaddr; hostlen._0_4_ = (int)hostlen + 1) {
      if (de->addr[(int)hostlen].type == 0x1c) {
        _cStack_70 = 0x1c;
        local_72 = 10;
      }
      else {
        _cStack_70 = 0x10;
        local_72 = 2;
      }
      pCVar6 = (Curl_addrinfo *)(*Curl_ccalloc)(1,_cStack_70 + 0x30 + sVar5 + 1);
      if (pCVar6 == (Curl_addrinfo *)0x0) {
        hostlen._4_4_ = CURLE_OUT_OF_MEMORY;
        break;
      }
      pCVar6->ai_addr = (sockaddr *)(pCVar6 + 1);
      pCVar6->ai_canonname = pCVar6->ai_addr->sa_data + _cStack_70 + -2;
      memcpy(pCVar6->ai_canonname,hostname,sVar5 + 1);
      if (addr == (sockaddr_in *)0x0) {
        addr = (sockaddr_in *)pCVar6;
      }
      if (firstai != (Curl_addrinfo *)0x0) {
        firstai->ai_next = pCVar6;
      }
      ((in_addr *)&pCVar6->ai_family)->s_addr = (uint)local_72;
      pCVar6->ai_socktype = 1;
      pCVar6->ai_addrlen = cStack_70;
      iVar1 = ((in_addr *)&pCVar6->ai_family)->s_addr;
      if (iVar1 == 2) {
        psVar2 = pCVar6->ai_addr;
        *(undefined4 *)(psVar2->sa_data + 2) = *(undefined4 *)&de->addr[(int)hostlen].ip;
        psVar2->sa_family = local_72;
        uVar4 = htons((uint16_t)port);
        *(uint16_t *)psVar2->sa_data = uVar4;
      }
      else if (iVar1 == 10) {
        psVar2 = pCVar6->ai_addr;
        *(undefined8 *)(psVar2->sa_data + 6) = *(undefined8 *)&de->addr[(int)hostlen].ip;
        uVar3 = *(undefined8 *)((long)&de->addr[(int)hostlen].ip + 8);
        psVar2[1].sa_family = (short)uVar3;
        psVar2[1].sa_data[0] = (char)((ulong)uVar3 >> 0x10);
        psVar2[1].sa_data[1] = (char)((ulong)uVar3 >> 0x18);
        psVar2[1].sa_data[2] = (char)((ulong)uVar3 >> 0x20);
        psVar2[1].sa_data[3] = (char)((ulong)uVar3 >> 0x28);
        psVar2[1].sa_data[4] = (char)((ulong)uVar3 >> 0x30);
        psVar2[1].sa_data[5] = (char)((ulong)uVar3 >> 0x38);
        psVar2->sa_family = local_72;
        uVar4 = htons((uint16_t)port);
        *(uint16_t *)psVar2->sa_data = uVar4;
      }
      firstai = pCVar6;
    }
    if (hostlen._4_4_ != CURLE_OK) {
      Curl_freeaddrinfo((Curl_addrinfo *)addr);
      addr = (sockaddr_in *)0x0;
    }
    *aip = (Curl_addrinfo *)addr;
    de_local._4_4_ = hostlen._4_4_;
  }
  return de_local._4_4_;
}

Assistant:

static CURLcode doh2ai(const struct dohentry *de, const char *hostname,
                       int port, struct Curl_addrinfo **aip)
{
  struct Curl_addrinfo *ai;
  struct Curl_addrinfo *prevai = NULL;
  struct Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef USE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  size_t hostlen = strlen(hostname) + 1; /* include null-terminator */

  DEBUGASSERT(de);

  if(!de->numaddr)
    return CURLE_COULDNT_RESOLVE_HOST;

  for(i = 0; i < de->numaddr; i++) {
    size_t ss_size;
    CURL_SA_FAMILY_T addrtype;
    if(de->addr[i].type == DNS_TYPE_AAAA) {
#ifndef USE_IPV6
      /* we cannot handle IPv6 addresses */
      continue;
#else
      ss_size = sizeof(struct sockaddr_in6);
      addrtype = AF_INET6;
#endif
    }
    else {
      ss_size = sizeof(struct sockaddr_in);
      addrtype = AF_INET;
    }

    ai = calloc(1, sizeof(struct Curl_addrinfo) + ss_size + hostlen);
    if(!ai) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    ai->ai_addr = (void *)((char *)ai + sizeof(struct Curl_addrinfo));
    ai->ai_canonname = (void *)((char *)ai->ai_addr + ss_size);
    memcpy(ai->ai_canonname, hostname, hostlen);

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch(ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */
      DEBUGASSERT(sizeof(struct in_addr) == sizeof(de->addr[i].ip.v4));
      memcpy(&addr->sin_addr, &de->addr[i].ip.v4, sizeof(struct in_addr));
#ifdef __MINGW32__
      addr->sin_family = (short)addrtype;
#else
      addr->sin_family = addrtype;
#endif
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef USE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */
      DEBUGASSERT(sizeof(struct in6_addr) == sizeof(de->addr[i].ip.v6));
      memcpy(&addr6->sin6_addr, &de->addr[i].ip.v6, sizeof(struct in6_addr));
#ifdef __MINGW32__
      addr6->sin6_family = (short)addrtype;
#else
      addr6->sin6_family = addrtype;
#endif
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }
  *aip = firstai;

  return result;
}